

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::
     PrintValue<std::multiset<jessilib::object,std::less<jessilib::object>,std::allocator<jessilib::object>>,void>
               (multiset<jessilib::object,_std::less<jessilib::object>,_std::allocator<jessilib::object>_>
                *container,ostream *os)

{
  _Base_ptr p_Var1;
  long lVar2;
  
  std::operator<<(os,'{');
  p_Var1 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar2 = 0;
  do {
    if ((_Rb_tree_header *)p_Var1 == &(container->_M_t)._M_impl.super__Rb_tree_header) {
      if (lVar2 != 0) {
LAB_001d5388:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_001d5388;
    }
    std::operator<<(os,' ');
    RawBytesPrinter::PrintValue<jessilib::object,64ul>((object *)(p_Var1 + 1),os);
    lVar2 = lVar2 + 1;
    p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }